

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

Hop_Obj_t * Abc_ConvertSopToAigInternal(Hop_Man_t *pMan,char *pSop)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pHVar6;
  char *pcVar7;
  long lVar8;
  Hop_Obj_t *p0;
  
  iVar3 = Abc_SopGetVarNum(pSop);
  iVar4 = Abc_SopIsExorType(pSop);
  p0 = (Hop_Obj_t *)((ulong)pMan->pConst1 ^ 1);
  if (iVar4 == 0) {
    if (*pSop != '\0') {
      pcVar7 = pSop;
LAB_008454ec:
      pHVar5 = pMan->pConst1;
      lVar8 = 0;
      do {
        bVar2 = pcVar7[lVar8];
        if (bVar2 < 0x31) {
          if (bVar2 == 0x30) {
            pHVar6 = Hop_IthVar(pMan,(int)lVar8);
            pHVar6 = (Hop_Obj_t *)((ulong)pHVar6 ^ 1);
LAB_00845520:
            pHVar5 = Hop_And(pMan,pHVar5,pHVar6);
          }
          else if ((bVar2 == 0) || (bVar2 == 0x20)) goto LAB_0084553f;
        }
        else if (bVar2 == 0x31) {
          pHVar6 = Hop_IthVar(pMan,(int)lVar8);
          goto LAB_00845520;
        }
        lVar8 = lVar8 + 1;
      } while( true );
    }
  }
  else if (0 < iVar3) {
    iVar4 = 0;
    do {
      pHVar5 = Hop_IthVar(pMan,iVar4);
      p0 = Hop_Exor(pMan,p0,pHVar5);
      iVar4 = iVar4 + 1;
    } while (iVar3 != iVar4);
  }
LAB_0084555a:
  iVar3 = Abc_SopIsComplement(pSop);
  pHVar5 = (Hop_Obj_t *)((ulong)p0 ^ 1);
  if (iVar3 == 0) {
    pHVar5 = p0;
  }
  return pHVar5;
LAB_0084553f:
  p0 = Hop_Or(pMan,p0,pHVar5);
  pcVar1 = pcVar7 + (iVar3 + 3);
  pcVar7 = pcVar7 + (iVar3 + 3);
  if (*pcVar1 == '\0') goto LAB_0084555a;
  goto LAB_008454ec;
}

Assistant:

Hop_Obj_t * Abc_ConvertSopToAigInternal( Hop_Man_t * pMan, char * pSop )
{
    Hop_Obj_t * pAnd, * pSum;
    int i, Value, nFanins;
    char * pCube;
    // get the number of variables
    nFanins = Abc_SopGetVarNum(pSop);
    if ( Abc_SopIsExorType(pSop) )
    {
        pSum = Hop_ManConst0(pMan); 
        for ( i = 0; i < nFanins; i++ )
            pSum = Hop_Exor( pMan, pSum, Hop_IthVar(pMan,i) );
    }
    else
    {
        // go through the cubes of the node's SOP
        pSum = Hop_ManConst0(pMan); 
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            // create the AND of literals
            pAnd = Hop_ManConst1(pMan);
            Abc_CubeForEachVar( pCube, Value, i )
            {
                if ( Value == '1' )
                    pAnd = Hop_And( pMan, pAnd, Hop_IthVar(pMan,i) );
                else if ( Value == '0' )
                    pAnd = Hop_And( pMan, pAnd, Hop_Not(Hop_IthVar(pMan,i)) );
            }
            // add to the sum of cubes
            pSum = Hop_Or( pMan, pSum, pAnd );
        }
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        pSum = Hop_Not(pSum);
    return pSum;
}